

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

int __thiscall Epoll::poll(Epoll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint __errnum;
  epoll_event *__events;
  int event_count;
  uint *puVar1;
  char *pcVar2;
  int unaff_EBP;
  
  do {
    __events = (epoll_event *)
               (this->ep_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
               _M_impl.super__Vector_impl_data._M_start;
    event_count = epoll_wait(this->ep_epoll_fd,__events,
                             (int)((ulong)((long)(this->ep_events).
                                                 super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)__events) >> 2) * -0x55555555,20000);
    if (event_count < 0) {
      if (-1 < pr_level) {
        puVar1 = (uint *)__errno_location();
        __errnum = *puVar1;
        pcVar2 = strerror(__errnum);
        printf("[%-5s][%s:%d] epoll wait return val <0! error no:%d, error str:%s\n","error","poll",
               0x5c,(ulong)__errnum,pcVar2);
      }
    }
    else {
      execute_cbs(this,event_count);
      unaff_EBP = event_count;
    }
  } while (event_count < 0);
  return unaff_EBP;
}

Assistant:

int Epoll::poll() {
    while (true) {
        int event_count =
            epoll_wait(ep_epoll_fd, &*ep_events.begin(), ep_events.size(), EPOLLWAIT_TIME);
        if (event_count < 0)
        {
            PR_ERROR("epoll wait return val <0! error no:%d, error str:%s\n", errno, strerror(errno));
            continue;
        }

        execute_cbs(event_count);
        return event_count;
    }
}